

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpeg2StreamReader.cpp
# Opt level: O3

CheckStreamRez * __thiscall
MPEG2StreamReader::checkStream
          (CheckStreamRez *__return_storage_ptr__,MPEG2StreamReader *this,uint8_t *buffer,int len)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  long lVar4;
  uint8_t *puVar5;
  byte bVar6;
  bool bVar7;
  byte *pbVar8;
  byte *pbVar9;
  byte *pbVar10;
  byte *end;
  BitStreamReader bitReader;
  MPEGPictureHeader frame;
  BitStreamReader local_110;
  MPEGSequenceHeader *local_f0;
  string *local_e8;
  byte *local_e0;
  byte *local_d8;
  string local_d0;
  MPEGPictureHeader local_b0;
  
  (__return_storage_ptr__->codecInfo).codecID = 0;
  (__return_storage_ptr__->codecInfo).displayName._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->codecInfo).displayName.field_2;
  (__return_storage_ptr__->codecInfo).displayName._M_string_length = 0;
  (__return_storage_ptr__->codecInfo).displayName.field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->codecInfo).programName._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->codecInfo).programName.field_2;
  (__return_storage_ptr__->codecInfo).programName._M_string_length = 0;
  (__return_storage_ptr__->codecInfo).programName.field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->streamDescr)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->streamDescr).field_2;
  (__return_storage_ptr__->streamDescr)._M_string_length = 0;
  (__return_storage_ptr__->streamDescr).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->lang)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->lang).field_2
  ;
  (__return_storage_ptr__->lang)._M_string_length = 0;
  (__return_storage_ptr__->lang).field_2._M_local_buf[0] = '\0';
  __return_storage_ptr__->trackID = 0;
  __return_storage_ptr__->delay = 0;
  *(undefined4 *)((long)&__return_storage_ptr__->delay + 7) = 0;
  local_110.super_BitStream.m_totalBits = 0;
  local_110.super_BitStream.m_buffer = (uint *)0x0;
  local_110.super_BitStream.m_initBuffer = (uint *)0x0;
  local_110.m_curVal = 0;
  local_110.m_bitLeft = 0;
  MPEGPictureHeader::MPEGPictureHeader(&local_b0,0);
  if (2 < len) {
    local_e8 = (string *)&__return_storage_ptr__->streamDescr;
    end = buffer + len;
    pbVar10 = buffer + 2;
    do {
      lVar4 = 3;
      if (*pbVar10 < 2) {
        if (*pbVar10 == 0) {
          lVar4 = 1;
        }
        else if ((pbVar10[-2] == 0) && (pbVar10[-1] == 0)) {
          pbVar10 = pbVar10 + -2;
          if (pbVar10 <= end + -0x20) {
            local_f0 = &this->m_sequence;
            local_e0 = end + -4;
            bVar7 = false;
            bVar6 = 0;
            bVar2 = 0;
            local_d8 = end + -0x20;
            goto LAB_001bbcf0;
          }
          break;
        }
      }
      pbVar10 = pbVar10 + lVar4;
    } while (pbVar10 < end);
  }
switchD_001bbd22_caseD_b4:
  MPEGRawDataHeader::~MPEGRawDataHeader(&local_b0.super_MPEGRawDataHeader);
  return __return_storage_ptr__;
LAB_001bbcf0:
  bVar1 = pbVar10[3];
  if ((byte)(bVar1 - 1) < 0xaf) {
    bVar2 = 1;
  }
  else {
    switch(bVar1) {
    case 0xb2:
    case 0xb7:
    case 0xb8:
      break;
    case 0xb3:
      for (pbVar8 = pbVar10 + 6; pbVar9 = end, pbVar8 < end; pbVar8 = pbVar8 + lVar4) {
        lVar4 = 3;
        if (*pbVar8 < 2) {
          if (*pbVar8 == 0) {
            lVar4 = 1;
          }
          else if ((pbVar8[-2] == 0) && (pbVar8[-1] == 0)) {
            pbVar9 = pbVar8 + -2;
            break;
          }
        }
      }
      puVar5 = MPEGSequenceHeader::deserialize
                         (local_f0,pbVar10 + 4,(int64_t)(pbVar9 + (-4 - (long)pbVar10)));
      if (puVar5 == (uint8_t *)0x0) goto switchD_001bbd22_caseD_b4;
      (this->super_MPEGStreamReader).m_streamAR = (uint)(this->m_sequence).aspect_ratio_info;
      this->spsFound = true;
      break;
    case 0xb4:
    case 0xb6:
      goto switchD_001bbd22_caseD_b4;
    case 0xb5:
      BitStream::setBuffer(&local_110.super_BitStream,pbVar10 + 4,end);
      local_110._24_8_ = local_110._24_8_ & 0xffffffff;
      local_110.m_curVal = BitStreamReader::getCurVal(&local_110,local_110.super_BitStream.m_buffer)
      ;
      local_110.m_bitLeft = 0x20;
      uVar3 = BitStreamReader::getBits(&local_110,4);
      if ((char)uVar3 == '\b') {
        MPEGPictureHeader::deserializeCodingExtension(&local_b0,&local_110);
        bVar7 = (bool)(bVar7 | local_b0.repeat_first_field != '\0');
      }
      else if ((uVar3 & 0xff) == 1) {
        MPEGSequenceHeader::deserializeExtension(local_f0,&local_110);
      }
      break;
    default:
      if (bVar1 != 0) goto switchD_001bbd22_caseD_b4;
      puVar5 = MPEGPictureHeader::deserialize(&local_b0,pbVar10 + 4,(long)local_e0 - (long)pbVar10);
      bVar6 = 1;
      if (puVar5 == (uint8_t *)0x0) goto switchD_001bbd22_caseD_b4;
    }
  }
  pbVar10 = pbVar10 + 6;
  do {
    if (end <= pbVar10) goto LAB_001bbecc;
    lVar4 = 3;
    if (*pbVar10 < 2) {
      if (*pbVar10 == 0) {
        lVar4 = 1;
      }
      else if ((pbVar10[-2] == 0) && (pbVar10[-1] == 0)) break;
    }
    pbVar10 = pbVar10 + lVar4;
  } while( true );
  pbVar10 = pbVar10 + -2;
  if (local_d8 < pbVar10) goto LAB_001bbecc;
  goto LAB_001bbcf0;
LAB_001bbecc:
  if ((bVar6 & this->spsFound & bVar2) == 1) {
    (__return_storage_ptr__->codecInfo).codecID = ::mpeg2CodecInfo.codecID;
    std::__cxx11::string::_M_assign((string *)&(__return_storage_ptr__->codecInfo).displayName);
    std::__cxx11::string::_M_assign((string *)&(__return_storage_ptr__->codecInfo).programName);
    MPEGSequenceHeader::getStreamDescr_abi_cxx11_(&local_d0,local_f0);
    std::__cxx11::string::operator=(local_e8,(string *)&local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
    if (bVar7) {
      std::__cxx11::string::append((char *)local_e8);
    }
  }
  goto switchD_001bbd22_caseD_b4;
}

Assistant:

CheckStreamRez MPEG2StreamReader::checkStream(uint8_t* buffer, int len)
{
    CheckStreamRez rez;
    uint8_t* end = buffer + len;
    BitStreamReader bitReader{};
    uint8_t* nextNal = nullptr;
    bool sliceFound = false;
    bool pictureFound = false;
    bool pulldownFound = false;
    uint8_t extType = 0;
    MPEGPictureHeader frame(0);
    for (uint8_t* nal = MPEGHeader::findNextMarker(buffer, end); nal <= end - 32;
         nal = MPEGHeader::findNextMarker(nal + 4, end))
    {
        uint8_t unitType = nal[3];
        try
        {
            if (unitType >= SLICE_MIN_START_SHORT_CODE && unitType <= SLICE_MAX_START_SHORT_CODE)
                sliceFound = true;
            else
                switch (unitType)
                {
                case EXT_START_SHORT_CODE:
                    bitReader.setBuffer(nal + 4, end);
                    extType = bitReader.getBits<uint8_t>(4);
                    if (extType == SEQUENCE_EXT)
                    {
                        m_sequence.deserializeExtension(bitReader);
                    }
                    else if (extType == PICTURE_CODING_EXT)
                    {
                        frame.deserializeCodingExtension(bitReader);
                        pulldownFound |= frame.repeat_first_field > 0;
                    }
                    break;
                case SEQ_END_SHORT_CODE:
                case GOP_START_SHORT_CODE:
                case USER_START_SHORT_CODE:
                    break;
                case PICTURE_START_SHORT_CODE:
                    if (frame.deserialize(nal + 4, end - nal - 4) == nullptr)
                        return rez;
                    pictureFound = true;
                    break;
                case SEQ_START_SHORT_CODE:
                    nextNal = MPEGHeader::findNextMarker(nal + 4, end);
                    if (m_sequence.deserialize(nal + 4, nextNal - nal - 4) == nullptr)
                        return rez;
                    m_streamAR = static_cast<VideoAspectRatio>(m_sequence.aspect_ratio_info);
                    spsFound = true;
                    break;
                default:
                    return rez;
                }
        }
        catch (BitStreamException& e)
        {
            (void)e;
            // return rez;
        }
    }
    if (spsFound && pictureFound && sliceFound)
    {
        rez.codecInfo = mpeg2CodecInfo;
        rez.streamDescr = m_sequence.getStreamDescr();
        if (pulldownFound)
            rez.streamDescr += " (pulldown)";
    }
    return rez;
}